

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O0

size_t stripctrl_locale_try_consume(StripCtrlCharsImpl *scc,char *p,size_t len)

{
  mbstate_t mVar1;
  size_t consumed;
  mbstate_t mbs_orig;
  wchar_t wc;
  size_t len_local;
  char *p_local;
  StripCtrlCharsImpl *scc_local;
  
  mVar1 = scc->mbs_in;
  unique0x10000094 = len;
  scc_local = (StripCtrlCharsImpl *)mbrtowc(&mbs_orig.__count,p,len,(mbstate_t *)scc);
  if (scc_local == (StripCtrlCharsImpl *)0xfffffffffffffffe) {
    scc->mbs_in = mVar1;
    scc_local = (StripCtrlCharsImpl *)0x0;
  }
  else if (scc_local == (StripCtrlCharsImpl *)0xffffffffffffffff) {
    memset(scc,0,8);
    scc_local = (StripCtrlCharsImpl *)0x1;
  }
  else if (scc_local == (StripCtrlCharsImpl *)0x0) {
    stripctrl_locale_put_wc(scc,L'\0');
    scc_local = (StripCtrlCharsImpl *)0x1;
  }
  else {
    stripctrl_locale_put_wc(scc,mbs_orig.__count);
  }
  return (size_t)scc_local;
}

Assistant:

static inline size_t stripctrl_locale_try_consume(
    StripCtrlCharsImpl *scc, const char *p, size_t len)
{
    wchar_t wc;
    mbstate_t mbs_orig = scc->mbs_in;
    size_t consumed = mbrtowc(&wc, p, len, &scc->mbs_in);

    if (consumed == (size_t)-2) {
        /*
         * The buffer is too short to see the end of the multibyte
         * character that it appears to be starting with. We return 0
         * for 'no data consumed', restore the conversion state from
         * before consuming the partial character, and our caller will
         * come back when it has more data available.
         */
        scc->mbs_in = mbs_orig;
        return 0;
    }

    if (consumed == (size_t)-1) {
        /*
         * The buffer contains an illegal multibyte sequence. There's
         * no really good way to recover from this, so we'll just
         * reset our input state, consume a single byte without
         * emitting anything, and hope we can resynchronise to
         * _something_ sooner or later.
         */
        memset(&scc->mbs_in, 0, sizeof(scc->mbs_in));
        return 1;
    }

    if (consumed == 0) {
        /*
         * A zero wide character is encoded by the data, but mbrtowc
         * hasn't told us how many input bytes it takes. There isn't
         * really anything good we can do here, so we just advance by
         * one byte in the hope that that was the NUL.
         *
         * (If it wasn't - that is, if we're in a multibyte encoding
         * in which the terminator of a normal C string is encoded in
         * some way other than a single zero byte - then probably lots
         * of other things will have gone wrong before we get here!)
         */
        stripctrl_locale_put_wc(scc, L'\0');
        return 1;
    }

    /*
     * Otherwise, this is the easy case: consumed > 0, and we've eaten
     * a valid multibyte character.
     */
    stripctrl_locale_put_wc(scc, wc);
    return consumed;
}